

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error_message.cpp
# Opt level: O0

void ON_ErrorMessage(int message_type,char *sErrorMessage)

{
  char *sErrorMessage_local;
  int message_type_local;
  
  return;
}

Assistant:

void ON_ErrorMessage(
        int message_type, // 0=warning - serious problem that code is designed to handle
                          // 1=error - serious problem code will attempt to handle
                          //           The thing causing the error is a bug that must
                          //           be fixed.
                          // 2=assert failed - crash is nearly certain
        const char* sErrorMessage 
        )
{
  // error/warning/assert message is in sMessage[] buffer.  Modify this function
  // to do whatever you want to with the message.
  if ( sErrorMessage && sErrorMessage[0] ) 
  {
#if defined(ON_COMPILER_MSC)
    ::OutputDebugStringA( "\n" );
    ::OutputDebugStringA( sErrorMessage );
    ::OutputDebugStringA( "\n" );
#elif defined(ON__DEBUG)
    // not using OutputDebugStringA
    printf("\n%s\n",sErrorMessage);
#endif
  }
}